

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O0

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::SegmentO2::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,SegmentO2 *this,RefinementPattern *ref_pat,dim_t codim)

{
  Scalar SVar1;
  RefElType RVar2;
  RefElType RVar3;
  size_type sVar4;
  uint uVar5;
  ostream *poVar6;
  runtime_error *prVar7;
  size_type sVar8;
  PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *pPVar9;
  Index IVar10;
  ulong uVar11;
  DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *pDVar12;
  string local_df8;
  allocator<char> local_dd1;
  string local_dd0;
  allocator<char> local_da9;
  string local_da8;
  stringstream local_d88 [8];
  stringstream ss_5;
  ostream local_d78 [376];
  Matrix<double,__1,__1,_0,__1,__1> local_c00;
  undefined1 local_be8 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_be0;
  Type local_bd8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_bc8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_b90;
  Matrix<double,__1,__1,_0,__1,__1> local_b70;
  undefined1 local_b58 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_b50;
  Type local_b48;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_b38;
  double local_b00;
  Type local_af8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_ae8;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_ab0;
  uint local_a90 [2];
  undefined1 local_a88 [8];
  MatrixXd locCoords;
  allocator<char> local_a49;
  string local_a48;
  allocator<char> local_a21;
  string local_a20;
  stringstream local_a00 [8];
  stringstream ss_4;
  ostream local_9f0 [376];
  string local_878;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  stringstream local_808 [8];
  stringstream ss_3;
  ostream local_7f8 [376];
  size_type local_680;
  size_t child;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  stringstream local_608 [8];
  stringstream ss_2;
  ostream local_5f8 [376];
  size_type local_480;
  size_t noChildren;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  childPolygons;
  double local_458;
  double hLattice;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  stringstream local_3e0 [8];
  stringstream ss_1;
  ostream local_3d0 [376];
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  RefEl local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [378];
  RefEl local_26;
  RefEl local_25;
  dim_t local_24;
  RefinementPattern *pRStack_20;
  dim_t codim_local;
  RefinementPattern *ref_pat_local;
  SegmentO2 *this_local;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *childGeoPtrs;
  
  local_24 = codim;
  pRStack_20 = ref_pat;
  ref_pat_local = (RefinementPattern *)this;
  this_local = (SegmentO2 *)__return_storage_ptr__;
  local_25 = RefinementPattern::RefEl(ref_pat);
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_25);
  local_26 = lf::base::RefEl::kSegment();
  RVar3 = lf::base::RefEl::operator_cast_to_RefElType(&local_26);
  if (RVar2 != RVar3) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar6 = std::operator<<(local_1a0,"Refinement pattern for ");
    local_1e1 = RefinementPattern::RefEl(pRStack_20);
    lf::base::RefEl::ToString_abi_cxx11_(&local_1e0,&local_1e1);
    std::operator<<(poVar6,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"ref_pat.RefEl() == lf::base::RefEl::kSegment()",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
               ,&local_231);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_208,&local_230,0x5d,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (1 < local_24) {
    std::__cxx11::stringstream::stringstream(local_3e0);
    poVar6 = std::operator<<(local_3d0,"Illegal codim = ");
    std::ostream::operator<<(poVar6,local_24);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"codim < 2",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
               ,&local_429);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_400,&local_428,0x5e,(string *)&hLattice);
    std::__cxx11::string::~string((string *)&hLattice);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar4 = RefinementPattern::LatticeConst(pRStack_20);
  local_458 = 1.0 / (double)sVar4;
  childPolygons.
  super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::vector(__return_storage_ptr__);
  (*pRStack_20->_vptr_RefinementPattern[1])(&noChildren,pRStack_20,(ulong)local_24);
  sVar8 = std::
          vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
          ::size((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                  *)&noChildren);
  local_480 = sVar8;
  uVar5 = (**pRStack_20->_vptr_RefinementPattern)(pRStack_20,(ulong)local_24);
  if (sVar8 != uVar5) {
    std::__cxx11::stringstream::stringstream(local_608);
    poVar6 = std::operator<<(local_5f8,"NumChildren ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_480);
    poVar6 = std::operator<<(poVar6," <-> ");
    uVar5 = (**pRStack_20->_vptr_RefinementPattern)(pRStack_20,(ulong)local_24);
    std::ostream::operator<<(poVar6,uVar5);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_628,"noChildren == ref_pat.NumChildren(codim)",&local_629);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_650,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
               ,&local_651);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_628,&local_650,0x6a,(string *)&child);
    std::__cxx11::string::~string((string *)&child);
    std::__cxx11::string::~string((string *)&local_650);
    std::allocator<char>::~allocator(&local_651);
    std::__cxx11::string::~string((string *)&local_628);
    std::allocator<char>::~allocator(&local_629);
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar7,"this code should not be reached");
    __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_680 = 0;
  while( true ) {
    if (local_480 <= local_680) {
      childPolygons.
      super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      std::
      vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                 *)&noChildren);
      if ((childPolygons.
           super__Vector_base<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::~vector(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    pPVar9 = &std::
              vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            *)&noChildren,local_680)->
              super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
    IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar9);
    if (IVar10 != 1) break;
    pPVar9 = &std::
              vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
              ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                            *)&noChildren,local_680)->
              super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
    uVar11 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
    if (uVar11 != 2 - local_24) {
      std::__cxx11::stringstream::stringstream(local_a00);
      poVar6 = std::operator<<(local_9f0,"childPolygons[child].cols() = ");
      pPVar9 = &std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)&noChildren,local_680)->
                super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
      IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols(pPVar9);
      std::ostream::operator<<(poVar6,IVar10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a20,"childPolygons[child].cols() == (2 - codim)",&local_a21);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a48,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,&local_a49);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed
                (&local_a20,&local_a48,0x75,
                 (string *)
                 &locCoords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols);
      std::__cxx11::string::~string
                ((string *)
                 &locCoords.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols);
      std::__cxx11::string::~string((string *)&local_a48);
      std::allocator<char>::~allocator(&local_a49);
      std::__cxx11::string::~string((string *)&local_a20);
      std::allocator<char>::~allocator(&local_a21);
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"this code should not be reached");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_a90[1] = 1;
    local_a90[0] = local_24 * -2 + 3;
    Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_int>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_a88,(int *)(local_a90 + 1),local_a90);
    if (local_24 == 0) {
      pDVar12 = (DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)
                std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)&noChildren,local_680);
      Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>(&local_af8,pDVar12);
      Eigen::operator*(&local_ae8,&local_458,(StorageBaseType *)&local_af8);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                (&local_ab0,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a88,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_ae8);
      pDVar12 = (DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)
                std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)&noChildren,local_680);
      Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>(&local_b48,pDVar12);
      Eigen::operator*(&local_b38,&local_458,(StorageBaseType *)&local_b48);
      SVar1 = Eigen::
              DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>_>
              ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                     *)&local_b38);
      local_b00 = SVar1 * 0.5;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (&local_ab0,&local_b00);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                (&local_ab0);
      (*(this->super_Geometry)._vptr_Geometry[3])(&local_b70,this,local_a88);
      std::make_unique<lf::geometry::SegmentO2,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_b58);
      std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
      unique_ptr<lf::geometry::SegmentO2,std::default_delete<lf::geometry::SegmentO2>,void>
                ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
                 &local_b50,
                 (unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                  *)local_b58);
      std::
      vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_b50);
      std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
      ~unique_ptr(&local_b50);
      std::unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>::
      ~unique_ptr((unique_ptr<lf::geometry::SegmentO2,_std::default_delete<lf::geometry::SegmentO2>_>
                   *)local_b58);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_b70);
    }
    else {
      if (local_24 != 1) {
        std::__cxx11::stringstream::stringstream(local_d88);
        std::operator<<(local_d78,"Illegal co-dimension");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_da8,"false",&local_da9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_dd0,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                   ,&local_dd1);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_da8,&local_dd0,0x89,&local_df8);
        std::__cxx11::string::~string((string *)&local_df8);
        std::__cxx11::string::~string((string *)&local_dd0);
        std::allocator<char>::~allocator(&local_dd1);
        std::__cxx11::string::~string((string *)&local_da8);
        std::allocator<char>::~allocator(&local_da9);
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"this code should not be reached");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pDVar12 = (DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)
                std::
                vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                              *)&noChildren,local_680);
      Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>(&local_bd8,pDVar12);
      Eigen::operator*(&local_bc8,&local_458,(StorageBaseType *)&local_bd8);
      Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                (&local_b90,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a88,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_bc8);
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                (&local_b90);
      (*(this->super_Geometry)._vptr_Geometry[3])(&local_c00,this,local_a88);
      std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_be8);
      std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
      unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
                ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
                 &local_be0,
                 (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                 local_be8);
      std::
      vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_be0);
      std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
      ~unique_ptr(&local_be0);
      std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
                ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                 local_be8);
      Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_c00);
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_a88);
    local_680 = local_680 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_808);
  poVar6 = std::operator<<(local_7f8,"childPolygons[child].rows() = ");
  pPVar9 = &std::
            vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
            ::operator[]((vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
                          *)&noChildren,local_680)->
            super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>;
  IVar10 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows(pPVar9);
  std::ostream::operator<<(poVar6,IVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_828,"childPolygons[child].rows() == 1",&local_829);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_850,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
             ,&local_851);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_828,&local_850,0x72,&local_878);
  std::__cxx11::string::~string((string *)&local_878);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator(&local_851);
  std::__cxx11::string::~string((string *)&local_828);
  std::allocator<char>::~allocator(&local_829);
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"this code should not be reached");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::unique_ptr<Geometry>> SegmentO2::ChildGeometry(
    const RefinementPattern& ref_pat, base::dim_t codim) const {
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kSegment(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  LF_VERIFY_MSG(codim < 2, "Illegal codim = " << codim);

  const double hLattice = 1. / static_cast<double>(ref_pat.LatticeConst());
  std::vector<std::unique_ptr<Geometry>> childGeoPtrs = {};

  // get coordinates of childGeometries
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>> childPolygons(
      ref_pat.ChildPolygons(codim));

  const size_t noChildren = childPolygons.size();
  LF_VERIFY_MSG(
      noChildren == ref_pat.NumChildren(codim),
      "NumChildren " << noChildren << " <-> " << ref_pat.NumChildren(codim));

  // create a geometry object for each child
  for (size_t child = 0; child < noChildren; ++child) {
    // codim == 0: a child segment is described by a polygon with three vertices
    // codim == 1: a child point by a single point ("polygon with one corner")
    LF_VERIFY_MSG(
        childPolygons[child].rows() == 1,
        "childPolygons[child].rows() = " << childPolygons[child].rows());
    LF_VERIFY_MSG(
        childPolygons[child].cols() == (2 - codim),
        "childPolygons[child].cols() = " << childPolygons[child].cols());

    Eigen::MatrixXd locCoords(1, 3 - 2 * codim);

    switch (codim) {
      case 0: {
        // SegmentO2 requires the coordinate of the midpoint
        locCoords << hLattice * childPolygons[child].cast<double>(),
            (hLattice * childPolygons[child].cast<double>()).sum() / 2;
        childGeoPtrs.push_back(std::make_unique<SegmentO2>(Global(locCoords)));

        break;
      }
      case 1: {
        locCoords << hLattice * childPolygons[child].cast<double>();
        childGeoPtrs.push_back(std::make_unique<Point>(Global(locCoords)));

        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
      }
    }
  }

  return childGeoPtrs;
}